

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

unsigned_long
rcg::anon_unknown_6::getStreamValue<unsigned_long>
          (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,STREAM_INFO_CMD cmd)

{
  element_type *peVar1;
  STREAM_INFO_CMD in_EDX;
  DS_HANDLE in_RSI;
  size_t size;
  INFO_DATATYPE type;
  unsigned_long ret;
  size_t local_30;
  INFO_DATATYPE local_24;
  unsigned_long local_20;
  STREAM_INFO_CMD local_14;
  DS_HANDLE local_10;
  
  local_20 = 0;
  local_30 = 8;
  if (in_RSI != (DS_HANDLE)0x0) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1234e6);
    (*peVar1->DSGetInfo)(local_10,local_14,&local_24,&local_20,&local_30);
  }
  return local_20;
}

Assistant:

inline T getStreamValue(const std::shared_ptr<const GenTLWrapper> &gentl,
                                          void *stream, GenTL::STREAM_INFO_CMD cmd)
{
  T ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(T);

  if (stream != 0)
  {
    gentl->DSGetInfo(stream, cmd, &type, &ret, &size);
  }

  return ret;
}